

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O3

bool google::protobuf::compiler::java::NestedInFileClass(EnumDescriptor *descriptor,bool immutable)

{
  byte bVar1;
  Nonnull<const_char_*> failure_msg;
  undefined8 extraout_RAX;
  ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::JavaFeatures>,_(unsigned_char)__v_,_false>
  *in_RCX;
  JavaFeatures local_40;
  
  ValidateNestInFileClassFeature((java *)&local_40,descriptor);
  if ((StatusRep *)local_40.super_Message.super_MessageLite._vptr_MessageLite != (StatusRep *)0x1) {
    failure_msg = absl::lts_20250127::status_internal::MakeCheckFailString
                            ((Nonnull<const_absl::Status_*>)&local_40,
                             "ValidateNestInFileClassFeature(descriptor) is OK");
    if (((ulong)local_40.super_Message.super_MessageLite._vptr_MessageLite & 1) == 0) {
      absl::lts_20250127::status_internal::StatusRep::Unref
                ((StatusRep *)local_40.super_Message.super_MessageLite._vptr_MessageLite);
    }
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/helpers.cc"
               ,0x3da,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  protobuf::internal::InternalFeatureHelper::
  GetResolvedFeatureExtension<google::protobuf::EnumDescriptor,pb::JavaFeatures,(unsigned_char)11,false>
            (&local_40,(InternalFeatureHelper *)descriptor,(EnumDescriptor *)&pb::java,in_RCX);
  pb::JavaFeatures::~JavaFeatures(&local_40);
  if (local_40.field_0._impl_.nest_in_file_class_ == 3) {
    bVar1 = (descriptor->file_->options_->field_0)._impl_.java_multiple_files_ ^ 1;
  }
  else {
    bVar1 = 1;
    if (local_40.field_0._impl_.nest_in_file_class_ != 2) {
      if (local_40.field_0._impl_.nest_in_file_class_ == 0) {
        NestedInFileClass((java *)&local_40);
        __clang_call_terminate(extraout_RAX);
      }
      bVar1 = 0;
    }
  }
  return (bool)bVar1;
}

Assistant:

bool NestedInFileClass(const EnumDescriptor& descriptor, bool immutable) {
  ABSL_CHECK_OK(ValidateNestInFileClassFeature(descriptor));
  return NestInFileClass(descriptor, immutable);
}